

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O1

void hashAes1Rx4<true>(void *input,size_t inputSize,void *hash)

{
  longlong in_RCX;
  void *pvVar2;
  void *pvVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 alVar4;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_58;
  undefined8 uStack_50;
  void *pvVar1;
  
  pvVar1 = hash;
  if (0 < (long)inputSize) {
    pvVar2 = (void *)(inputSize + (long)input);
    pvVar3 = input;
    do {
      alVar4[1] = inputSize;
      alVar4[0] = (longlong)input;
      key[1] = in_RCX;
      key[0] = (longlong)pvVar1;
      alVar4 = soft_aesenc(alVar4,key);
      key_00[0] = alVar4[1];
      in[1] = inputSize;
      in[0] = (longlong)input;
      key_00[1] = in_RCX;
      alVar4 = soft_aesdec(in,key_00);
      key_01[0] = alVar4[1];
      in_00[1] = inputSize;
      in_00[0] = (longlong)input;
      key_01[1] = in_RCX;
      alVar4 = soft_aesenc(in_00,key_01);
      key_02[0] = alVar4[1];
      in_01[1] = inputSize;
      in_01[0] = (longlong)input;
      key_02[1] = in_RCX;
      alVar4 = soft_aesdec(in_01,key_02);
      pvVar1 = alVar4[1];
      pvVar3 = (void *)((long)pvVar3 + 0x40);
    } while (pvVar3 < pvVar2);
  }
  in_02[1] = inputSize;
  in_02[0] = (longlong)input;
  key_03[1] = in_RCX;
  key_03[0] = (longlong)pvVar1;
  alVar4 = soft_aesenc(in_02,key_03);
  key_04[0] = alVar4[1];
  in_03[1] = inputSize;
  in_03[0] = (longlong)input;
  key_04[1] = in_RCX;
  alVar4 = soft_aesdec(in_03,key_04);
  key_05[0] = alVar4[1];
  in_04[1] = inputSize;
  in_04[0] = (longlong)input;
  key_05[1] = in_RCX;
  alVar4 = soft_aesenc(in_04,key_05);
  key_06[0] = alVar4[1];
  in_05[1] = inputSize;
  in_05[0] = (longlong)input;
  key_06[1] = in_RCX;
  alVar4 = soft_aesdec(in_05,key_06);
  key_07[0] = alVar4[1];
  in_06[1] = inputSize;
  in_06[0] = (longlong)input;
  key_07[1] = in_RCX;
  alVar4 = soft_aesenc(in_06,key_07);
  key_08[0] = alVar4[1];
  local_58 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  uStack_50 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  in_07[1] = inputSize;
  in_07[0] = (longlong)input;
  key_08[1] = in_RCX;
  alVar4 = soft_aesdec(in_07,key_08);
  key_09[0] = alVar4[1];
  local_88 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  uStack_80 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
  in_08[1] = inputSize;
  in_08[0] = (longlong)input;
  key_09[1] = in_RCX;
  alVar4 = soft_aesenc(in_08,key_09);
  key_10[0] = alVar4[1];
  local_78 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  uStack_70 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
  in_09[1] = inputSize;
  in_09[0] = (longlong)input;
  key_10[1] = in_RCX;
  soft_aesdec(in_09,key_10);
  *(undefined8 *)hash = local_58;
  *(undefined8 *)((long)hash + 8) = uStack_50;
  *(undefined8 *)((long)hash + 0x10) = local_88;
  *(undefined8 *)((long)hash + 0x18) = uStack_80;
  *(undefined8 *)((long)hash + 0x20) = local_78;
  *(undefined8 *)((long)hash + 0x28) = uStack_70;
  *(undefined4 *)((long)hash + 0x30) = extraout_XMM0_Da_02;
  *(undefined4 *)((long)hash + 0x34) = extraout_XMM0_Db_02;
  *(undefined4 *)((long)hash + 0x38) = extraout_XMM0_Dc_02;
  *(undefined4 *)((long)hash + 0x3c) = extraout_XMM0_Dd_02;
  return;
}

Assistant:

void hashAes1Rx4(const void *input, size_t inputSize, void *hash) {
	assert(inputSize % 64 == 0);
	const uint8_t* inptr = (uint8_t*)input;
	const uint8_t* inputEnd = inptr + inputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 in0, in1, in2, in3;

	//intial state
	state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	//process 64 bytes at a time in 4 lanes
	while (inptr < inputEnd) {
		in0 = rx_load_vec_i128((rx_vec_i128*)inptr + 0);
		in1 = rx_load_vec_i128((rx_vec_i128*)inptr + 1);
		in2 = rx_load_vec_i128((rx_vec_i128*)inptr + 2);
		in3 = rx_load_vec_i128((rx_vec_i128*)inptr + 3);

		state0 = aesenc<softAes>(state0, in0);
		state1 = aesdec<softAes>(state1, in1);
		state2 = aesenc<softAes>(state2, in2);
		state3 = aesdec<softAes>(state3, in3);

		inptr += 64;
	}

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	state0 = aesenc<softAes>(state0, xkey0);
	state1 = aesdec<softAes>(state1, xkey0);
	state2 = aesenc<softAes>(state2, xkey0);
	state3 = aesdec<softAes>(state3, xkey0);

	state0 = aesenc<softAes>(state0, xkey1);
	state1 = aesdec<softAes>(state1, xkey1);
	state2 = aesenc<softAes>(state2, xkey1);
	state3 = aesdec<softAes>(state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, state3);
}